

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void wabt::anon_unknown_0::CWriter::SerializeFuncType(FuncType *func_type,string *serialized_type)

{
  Type TVar1;
  long lVar2;
  char cVar3;
  pointer pTVar4;
  string *digest;
  string *psVar5;
  undefined1 *puVar6;
  ulong uVar7;
  undefined1 *puVar8;
  wabt *this;
  string_view input;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this = (wabt *)(ulong)((int)((ulong)((long)(func_type->sig).param_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(func_type->sig).param_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                         (int)((ulong)((long)(func_type->sig).result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(func_type->sig).result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
  lVar2 = -((ulong)(this + 0xf) & 0xfffffffffffffff0);
  puVar6 = (undefined1 *)((long)&local_38 + lVar2);
  pTVar4 = (func_type->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar8 = puVar6;
  local_38 = serialized_type;
  if (((long)(func_type->sig).param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)pTVar4 & 0x7fffffff8U) != 0) {
    uVar7 = 0;
    do {
      TVar1 = pTVar4[uVar7];
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1a5d56;
      cVar3 = MangleType(TVar1);
      puVar6[uVar7] = cVar3;
      uVar7 = uVar7 + 1;
      pTVar4 = (func_type->sig).param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < ((ulong)((long)(func_type->sig).param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar4) >> 3 &
                     0xffffffff));
    puVar8 = puVar6 + uVar7;
  }
  *puVar8 = 0x20;
  puVar8 = puVar8 + 1;
  pTVar4 = (func_type->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  digest = (string *)
           ((long)(func_type->sig).result_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar4);
  if (((ulong)digest & 0x7fffffff8) != 0) {
    psVar5 = (string *)0x0;
    do {
      TVar1 = pTVar4[(long)psVar5];
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1a5d99;
      cVar3 = MangleType(TVar1);
      puVar8[(long)psVar5] = cVar3;
      psVar5 = (string *)((long)&(psVar5->_M_dataplus)._M_p + 1);
      pTVar4 = (func_type->sig).result_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      digest = (string *)
               ((ulong)((long)(func_type->sig).result_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pTVar4) >> 3 & 0xffffffff);
    } while (psVar5 < digest);
    puVar8 = puVar8 + (long)psVar5;
  }
  psVar5 = local_38;
  if ((wabt *)(puVar8 + -(long)puVar6) == this) {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1a5dd1;
    input._M_str = (char *)psVar5;
    input._M_len = (size_t)puVar6;
    sha256(this,input,digest);
    return;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1a5dff;
  __assert_fail("next_byte - mangled_signature == static_cast<ptrdiff_t>(len)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0x6b8,
                "static void wabt::(anonymous namespace)::CWriter::SerializeFuncType(const FuncType &, std::string &)"
               );
}

Assistant:

void CWriter::SerializeFuncType(const FuncType& func_type,
                                std::string& serialized_type) {
  unsigned int len = func_type.GetNumParams() + func_type.GetNumResults() + 1;

  char* const mangled_signature = static_cast<char*>(alloca(len));
  char* next_byte = mangled_signature;

  // step 1: serialize each param type
  for (Index i = 0; i < func_type.GetNumParams(); ++i) {
    *next_byte++ = MangleType(func_type.GetParamType(i));
  }

  // step 2: separate params and results with a space
  *next_byte++ = ' ';

  // step 3: serialize each result type
  for (Index i = 0; i < func_type.GetNumResults(); ++i) {
    *next_byte++ = MangleType(func_type.GetResultType(i));
  }

  assert(next_byte - mangled_signature == static_cast<ptrdiff_t>(len));

  // step 4: SHA-256 the whole string
  sha256({mangled_signature, len}, serialized_type);
}